

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O3

void Eigen::internal::
     Assignment<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::swap_assign_op<double>,_Eigen::internal::Dense2Triangular,_void>
     ::run(TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *dst,
          Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *src,swap_assign_op<double> *func)

{
  double dVar1;
  non_const_type pMVar2;
  long lVar3;
  MatrixTypeNested pMVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  
  pMVar2 = src->m_matrix;
  lVar3 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  pMVar4 = dst->m_matrix;
  if (((pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
       == lVar3) &&
     (lVar5 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows,
     (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
     lVar5)) {
    if (0 < lVar5) {
      pdVar6 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      pdVar8 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      lVar9 = 0;
      do {
        lVar10 = lVar9;
        if (lVar3 < lVar9) {
          lVar10 = lVar3;
        }
        if (0 < lVar10) {
          lVar7 = 0;
          pdVar11 = pdVar6;
          do {
            dVar1 = pdVar8[lVar7];
            pdVar8[lVar7] = *pdVar11;
            *pdVar11 = dVar1;
            lVar7 = lVar7 + 1;
            pdVar11 = pdVar11 + lVar5;
          } while (lVar10 != lVar7);
        }
        lVar9 = lVar9 + 1;
        pdVar6 = pdVar6 + 1;
        pdVar8 = pdVar8 + lVar3;
      } while (lVar9 != lVar5);
    }
    return;
  }
  __assert_fail("rows==this->rows() && cols==this->cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/TriangularMatrix.h"
                ,0x48,
                "void Eigen::TriangularBase<Eigen::TriangularView<Eigen::Matrix<double, -1, -1>, 10>>::resize(Index, Index) [Derived = Eigen::TriangularView<Eigen::Matrix<double, -1, -1>, 10>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    inline Scalar coeff(Index row, Index col) const  { return derived().coeff(row,col); }